

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void run_container_smart_append_exclusive(run_container_t *src,uint16_t start,uint16_t length)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  rle16_t *prVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint16_t uVar9;
  
  iVar5 = src->n_runs;
  prVar4 = src->runs;
  if ((long)iVar5 == 0) {
LAB_0010c2dc:
    prVar4->value = start;
    prVar4->length = length;
  }
  else {
    prVar4 = prVar4 + iVar5;
    uVar6 = (uint)start;
    uVar1 = prVar4[-1].value;
    uVar2 = prVar4[-1].length;
    uVar7 = (uint)uVar2 + (uint)uVar1;
    uVar8 = (uint)uVar2 + (uint)uVar1 + 1;
    if (uVar8 < uVar6) goto LAB_0010c2dc;
    if (uVar8 == uVar6) {
      prVar4[-1].length = length + uVar2 + 1;
      return;
    }
    uVar9 = length + start + 1;
    uVar6 = length + uVar6;
    uVar2 = (ushort)uVar7;
    uVar3 = (ushort)uVar6;
    if (uVar1 == start) {
      if (uVar6 < uVar7) {
        prVar4[-1].value = uVar9;
        prVar4[-1].length = uVar2 + ~uVar3;
        return;
      }
      if (uVar7 < uVar6) {
        prVar4[-1].value = (uint16_t)uVar8;
        prVar4[-1].length = uVar3 + ~uVar2;
        return;
      }
      iVar5 = iVar5 + -1;
      goto LAB_0010c2e5;
    }
    prVar4[-1].length = start + ~uVar1;
    if (uVar6 < uVar7) {
      prVar4->value = uVar9;
      prVar4->length = uVar2 + ~uVar3;
    }
    else {
      if (uVar6 <= uVar7) {
        return;
      }
      prVar4->value = (uint16_t)uVar8;
      prVar4->length = uVar3 + ~uVar2;
    }
  }
  iVar5 = iVar5 + 1;
LAB_0010c2e5:
  src->n_runs = iVar5;
  return;
}

Assistant:

void run_container_smart_append_exclusive(run_container_t *src,
                                          const uint16_t start,
                                          const uint16_t length) {
    int old_end;
    rle16_t *last_run = src->n_runs ? src->runs + (src->n_runs - 1) : NULL;
    rle16_t *appended_last_run = src->runs + src->n_runs;

    if (!src->n_runs ||
        (start > (old_end = last_run->value + last_run->length + 1))) {
        *appended_last_run = MAKE_RLE16(start, length);
        src->n_runs++;
        return;
    }
    if (old_end == start) {
        // we merge
        last_run->length += (length + 1);
        return;
    }
    int new_end = start + length + 1;

    if (start == last_run->value) {
        // wipe out previous
        if (new_end < old_end) {
            *last_run = MAKE_RLE16(new_end, old_end - new_end - 1);
            return;
        } else if (new_end > old_end) {
            *last_run = MAKE_RLE16(old_end, new_end - old_end - 1);
            return;
        } else {
            src->n_runs--;
            return;
        }
    }
    last_run->length = start - last_run->value - 1;
    if (new_end < old_end) {
        *appended_last_run = MAKE_RLE16(new_end, old_end - new_end - 1);
        src->n_runs++;
    } else if (new_end > old_end) {
        *appended_last_run = MAKE_RLE16(old_end, new_end - old_end - 1);
        src->n_runs++;
    }
}